

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O1

Mio_Library_t * Abc_SclDeriveGenlibSimple(void *pScl)

{
  Vec_Str_t *__ptr;
  Mio_Library_t *pMVar1;
  
  __ptr = Abc_SclProduceGenlibStrSimple((SC_Lib *)pScl);
  pMVar1 = Mio_LibraryRead(*(char **)((long)pScl + 8),__ptr->pArray,(char *)0x0,0);
  if (__ptr->pArray != (char *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (char *)0x0;
  }
  if (__ptr != (Vec_Str_t *)0x0) {
    free(__ptr);
  }
  if (pMVar1 == (Mio_Library_t *)0x0) {
    puts("Reading library has filed.");
  }
  else {
    printf("Derived GENLIB library \"%s\" with %d gates.\n",*pScl,(ulong)*(uint *)((long)pScl + 100)
          );
  }
  return pMVar1;
}

Assistant:

Mio_Library_t * Abc_SclDeriveGenlibSimple( void * pScl )
{
    SC_Lib * p = (SC_Lib *)pScl;
    Vec_Str_t * vStr = Abc_SclProduceGenlibStrSimple( p );
    Mio_Library_t * pLib = Mio_LibraryRead( p->pFileName, Vec_StrArray(vStr), NULL, 0 );  
    Vec_StrFree( vStr );
    if ( pLib )
        printf( "Derived GENLIB library \"%s\" with %d gates.\n", p->pName, SC_LibCellNum(p) );
    else
        printf( "Reading library has filed.\n" );
    return pLib;
}